

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds,ReadResult alreadyRead)

{
  long lVar1;
  ReadResult alreadyRead_00;
  SourceLocation location;
  long lVar2;
  int iVar3;
  void **__s;
  ulong uVar4;
  ulong uVar5;
  cmsghdr *__cmsg;
  void *pvVar6;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:720:11)>
  *location_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  FixVoid<kj::AsyncCapabilityStream::ReadResult> value;
  void *in_stack_00000018;
  OwnFd ownFd;
  undefined4 uStack_19c;
  Disposer *local_190;
  PromiseFulfiller<void> *local_188;
  Fault f;
  Vector<kj::OwnFd> trashFds;
  Array<void_*> cmsgSpace_heap;
  msghdr msg;
  iovec local_c8;
  void *cmsgSpace_stack [16];
  
  local_188 = (PromiseFulfiller<void> *)maxFds;
  if (alreadyRead.byteCount != 0 || (*(byte *)((long)buffer + 0x90) & 1) != 0) {
    msg.msg_control = (void *)0x0;
    msg.msg_controllen = 0;
    msg.msg_name = (void *)0x0;
    msg.msg_namelen = 0;
    msg._12_4_ = 0;
    msg.msg_flags = 0;
    msg._52_4_ = 0;
    msg.msg_iov = &local_c8;
    msg.msg_iovlen = 1;
    local_190 = (Disposer *)alreadyRead.byteCount;
    uVar4 = 0x810;
    if ((*(byte *)((long)buffer + 0x90) & 1) == 0) {
      uVar4 = (alreadyRead.byteCount * 4 + 7 & 0xfffffffffffffff8) + 0x10;
    }
    local_c8.iov_base = (void *)minBytes;
    local_c8.iov_len = (size_t)fdBuffer;
    if (uVar4 < 0x88) {
      cmsgSpace_heap.ptr = (void **)0x0;
      cmsgSpace_heap.size_ = 0;
      cmsgSpace_heap.disposer = (ArrayDisposer *)0x0;
      __s = cmsgSpace_stack;
    }
    else {
      __s = kj::_::HeapArrayDisposer::allocate<void*>(uVar4 >> 3);
      cmsgSpace_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      cmsgSpace_heap.ptr = __s;
      cmsgSpace_heap.size_ = uVar4 >> 3;
    }
    memset(__s,0,uVar4);
    msg.msg_control = __s;
    msg.msg_controllen = uVar4;
LAB_0038c742:
    uVar4 = recvmsg(*(int *)((long)buffer + 0x10),(msghdr *)&msg,0x40000000);
    if ((long)uVar4 < 0) goto code_r0x0038c75f;
    f.exception = (Exception *)0x0;
    uVar9 = 0;
    __cmsg = (cmsghdr *)0x0;
    uVar7 = msg.msg_controllen;
    if (0xf < msg.msg_controllen) {
      __cmsg = (cmsghdr *)msg.msg_control;
    }
    for (; __cmsg != (cmsghdr *)0x0; __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg)) {
      if (uVar7 < 0x10) {
        uVar5 = 0;
      }
      else {
        if ((__cmsg->cmsg_level == 1) && (__cmsg->cmsg_type == 1)) {
          uVar5 = __cmsg->cmsg_len;
          if (uVar7 <= __cmsg->cmsg_len) {
            uVar5 = uVar7;
          }
          trashFds.builder.endPtr = (OwnFd *)0x0;
          trashFds.builder.ptr = (OwnFd *)0x0;
          trashFds.builder.pos = (RemoveConst<kj::OwnFd> *)0x0;
          trashFds.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
          for (uVar8 = 0; (uVar5 - 0x10 & 0xfffffffffffffffc) != uVar8; uVar8 = uVar8 + 4) {
            ownFd.fd = *(int *)((long)&__cmsg[1].cmsg_len + uVar8);
            if (uVar9 < alreadyRead.byteCount) {
              OwnFd::operator=((OwnFd *)(maxFds + uVar9 * 4),&ownFd);
              uVar9 = uVar9 + 1;
            }
            else {
              Vector<kj::OwnFd>::add<kj::OwnFd>(&trashFds,&ownFd);
            }
            OwnFd::~OwnFd(&ownFd);
          }
          ArrayBuilder<kj::OwnFd>::dispose(&trashFds.builder);
        }
        else if (*(char *)((long)buffer + 0x90) == '\x01') {
          uVar5 = __cmsg->cmsg_len;
          if (uVar7 <= __cmsg->cmsg_len) {
            uVar5 = uVar7;
          }
          trashFds.builder.ptr = (OwnFd *)(__cmsg + 1);
          trashFds.builder.pos = (RemoveConst<kj::OwnFd> *)(uVar5 - 0x10);
          Vector<kj::AncillaryMessage>::add<int&,int&,kj::ArrayPtr<unsigned_char_const>&>
                    ((Vector<kj::AncillaryMessage> *)&f,&__cmsg->cmsg_level,&__cmsg->cmsg_type,
                     (ArrayPtr<const_unsigned_char> *)&trashFds);
        }
        uVar5 = 0;
        if (__cmsg->cmsg_len <= uVar7) {
          uVar5 = uVar7 - __cmsg->cmsg_len;
        }
      }
      uVar7 = uVar5;
    }
    if ((f.exception != (Exception *)0x0) && (*(char *)((long)buffer + 0x90) == '\x01')) {
      (**(code **)**(undefined8 **)((long)buffer + 0xa0))
                (*(undefined8 **)((long)buffer + 0xa0),f.exception,-(long)f.exception / 0x18);
    }
    in_stack_00000018 = (void *)((long)in_stack_00000018 + uVar9);
    ArrayBuilder<kj::AncillaryMessage>::dispose((ArrayBuilder<kj::AncillaryMessage> *)&f);
    local_190 = (Disposer *)(alreadyRead.byteCount - uVar9);
    local_188 = (PromiseFulfiller<void> *)(maxFds + uVar9 * 4);
    goto LAB_0038c9ab;
  }
  local_190 = (Disposer *)0x0;
  do {
    uVar4 = read(*(int *)((long)buffer + 0x10),(void *)minBytes,(size_t)fdBuffer);
    if (-1 < (long)uVar4) goto LAB_0038c9c5;
    iVar3 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  if (iVar3 == 0) {
    local_190 = (Disposer *)0x0;
LAB_0038ca14:
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&ownFd);
    cmsgSpace_stack[4] = local_188;
    cmsgSpace_stack[5] = local_190;
    cmsgSpace_stack[6] = (void *)alreadyRead.capCount;
    cmsgSpace_stack[7] = in_stack_00000018;
    f.exception = (Exception *)
                  kj::_::
                  SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:720:11)>
                  ::anon_class_64_7_61fcc940_for_func::operator();
    lVar2 = CONCAT44(uStack_19c,ownFd.fd);
    lVar1 = *(long *)(lVar2 + 8);
    cmsgSpace_stack[0] = buffer;
    cmsgSpace_stack[1] = (void *)minBytes;
    cmsgSpace_stack[2] = (void *)maxBytes;
    cmsgSpace_stack[3] = fdBuffer;
    if (lVar1 == 0 || (ulong)(lVar2 - lVar1) < 0x60) {
      pvVar6 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:720:11)>
                     *)((long)pvVar6 + 0x3a0);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long,kj::AsyncCapabilityStream::ReadResult)::_lambda()_3_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long,kj::AsyncCapabilityStream::ReadResult)::_lambda()_3_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ownFd,
                 (anon_class_64_7_61fcc940_for_func *)cmsgSpace_stack,&f.exception);
      *(void **)((long)pvVar6 + 0x3a8) = pvVar6;
    }
    else {
      *(undefined8 *)(lVar2 + 8) = 0;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:720:11)>
                     *)(lVar2 + -0x60);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long,kj::AsyncCapabilityStream::ReadResult)::_lambda()_3_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long,kj::AsyncCapabilityStream::ReadResult)::_lambda()_3_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ownFd,
                 (anon_class_64_7_61fcc940_for_func *)cmsgSpace_stack,&f.exception);
      *(long *)(lVar2 + -0x58) = lVar1;
    }
    msg.msg_name = &DAT_003d3151;
    msg._8_8_ = &DAT_003d31b0;
    msg.msg_iov = (iovec *)0x4c0000058b;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    trashFds.builder.ptr = (OwnFd *)location_00;
    kj::_::maybeChain<kj::AsyncCapabilityStream::ReadResult>
              ((OwnPromiseNode *)&local_c8,
               (Promise<kj::AsyncCapabilityStream::ReadResult> *)&trashFds,location);
    pvVar6 = local_c8.iov_base;
    local_c8.iov_base = (void *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_c8);
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)pvVar6;
    cmsgSpace_heap.ptr = (void **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&cmsgSpace_heap);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&trashFds);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ownFd);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)cmsgSpace_stack,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x238,iVar3,"n = ::read(fd, buffer, maxBytes)","");
  kj::_::Debug::Fault::~Fault((Fault *)cmsgSpace_stack);
LAB_0038cbed:
  value.capCount = (size_t)in_stack_00000018;
  value.byteCount = alreadyRead.capCount;
  Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,value);
  return (PromiseBase)(PromiseBase)this;
code_r0x0038c75f:
  iVar3 = kj::_::Debug::getOsErrorNumber(true);
  if (iVar3 != -1) goto code_r0x0038c76b;
  goto LAB_0038c742;
code_r0x0038c76b:
  if (iVar3 == 0) {
LAB_0038c9ab:
    Array<void_*>::~Array(&cmsgSpace_heap);
    if ((long)uVar4 < 0) goto LAB_0038ca14;
LAB_0038c9c5:
    if (uVar4 != 0) {
      if (uVar4 <= maxBytes && maxBytes - uVar4 != 0) {
        alreadyRead_00.capCount = alreadyRead.capCount + uVar4;
        alreadyRead_00.byteCount = (size_t)local_190;
        tryReadInternal(this,buffer,minBytes + uVar4,maxBytes - uVar4,
                        (OwnFd *)((long)fdBuffer - uVar4),(size_t)local_188,alreadyRead_00);
        return (PromiseBase)(PromiseBase)this;
      }
      alreadyRead.capCount = uVar4 + alreadyRead.capCount;
    }
  }
  else {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x27e,iVar3,"n = ::recvmsg(fd, &msg, RECVMSG_FLAGS)","");
    kj::_::Debug::Fault::~Fault(&f);
    Array<void_*>::~Array(&cmsgSpace_heap);
  }
  goto LAB_0038cbed;
}

Assistant:

Promise<ReadResult> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                      OwnFd* fdBuffer, size_t maxFds,
                                      ReadResult alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    if (maxFds == 0 && ancillaryMsgCallback == kj::none) {
      KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));

      struct iovec iov;
      memset(&iov, 0, sizeof(iov));
      iov.iov_base = buffer;
      iov.iov_len = maxBytes;
      msg.msg_iov = &iov;
      msg.msg_iovlen = 1;

      // Allocate space to receive a cmsg.
      size_t msgBytes;
      if (ancillaryMsgCallback == kj::none) {
#if __APPLE__ || __FreeBSD__
        // Until very recently (late 2018 / early 2019), FreeBSD suffered from a bug in which when
        // an SCM_RIGHTS message was truncated on delivery, it would not close the FDs that weren't
        // delivered -- they would simply leak: https://bugs.freebsd.org/131876
        //
        // My testing indicates that MacOS has this same bug as of today (April 2019). I don't know
        // if they plan to fix it or are even aware of it.
        //
        // To handle both cases, we will always provide space to receive 512 FDs. Hopefully, this is
        // greater than the maximum number of FDs that these kernels will transmit in one message
        // PLUS enough space for any other ancillary messages that could be sent before the
        // SCM_RIGHTS message to push it back in the buffer. I couldn't find any firm documentation
        // on these limits, though -- I only know that Linux is limited to 253, and I saw a hint in
        // a comment in someone else's application that suggested FreeBSD is the same. Hopefully,
        // then, this is sufficient to prevent attacks. But if not, there's nothing more we can do;
        // it's really up to the kernel to fix this.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
#else
        msgBytes = CMSG_SPACE(sizeof(int) * maxFds);
#endif
      } else {
        // If we want room for ancillary messages instead of or in addition to FDs, just use the
        // same amount of cushion as in the MacOS/FreeBSD case above.
        // Someday we may want to allow customization here, but there's no immediate use for it.
        msgBytes = CMSG_SPACE(sizeof(int) * 512);
      }

      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

#ifdef MSG_CMSG_CLOEXEC
      static constexpr int RECVMSG_FLAGS = MSG_CMSG_CLOEXEC;
#else
      static constexpr int RECVMSG_FLAGS = 0;
#endif

      KJ_NONBLOCKING_SYSCALL(n = ::recvmsg(fd, &msg, RECVMSG_FLAGS)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }

      if (n >= 0) {
        // Process all messages.
        //
        // WARNING DANGER: We have to be VERY careful not to miss a file descriptor here, because
        // if we do, then that FD will never be closed, and a malicious peer could exploit this to
        // fill up our FD table, creating a DoS attack. Some things to keep in mind:
        // - CMSG_SPACE() could have rounded up the space for alignment purposes, and this could
        //   mean we permitted the kernel to deliver more file descriptors than `maxFds`. We need
        //   to close the extras.
        // - We can receive multiple ancillary messages at once. In particular, there is also
        //   SCM_CREDENTIALS. The sender decides what to send. They could send SCM_CREDENTIALS
        //   first followed by SCM_RIGHTS. We need to make sure we see both.
        size_t nfds = 0;
        size_t spaceLeft = msg.msg_controllen;
        Vector<AncillaryMessage> ancillaryMessages;
        for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
            cmsg != nullptr; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
          if (spaceLeft >= CMSG_LEN(0) &&
              cmsg->cmsg_level == SOL_SOCKET && cmsg->cmsg_type == SCM_RIGHTS) {
            // Some operating systems (like MacOS) do not adjust csmg_len when the message is
            // truncated. We must do so ourselves or risk overrunning the buffer.
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = arrayPtr(reinterpret_cast<int*>(CMSG_DATA(cmsg)),
                                 (len - CMSG_LEN(0)) / sizeof(int));
            kj::Vector<kj::OwnFd> trashFds;
            for (auto fd: data) {
              kj::OwnFd ownFd(fd);
              if (nfds < maxFds) {
                fdBuffer[nfds++] = kj::mv(ownFd);
              } else {
                trashFds.add(kj::mv(ownFd));
              }
            }
          } else if (spaceLeft >= CMSG_LEN(0) && ancillaryMsgCallback != kj::none) {
            auto len = kj::min(cmsg->cmsg_len, spaceLeft);
            auto data = ArrayPtr<const byte>(CMSG_DATA(cmsg), len - CMSG_LEN(0));
            ancillaryMessages.add(cmsg->cmsg_level, cmsg->cmsg_type, data);
          }

          if (spaceLeft >= CMSG_LEN(0) && spaceLeft >= cmsg->cmsg_len) {
            spaceLeft -= cmsg->cmsg_len;
          } else {
            spaceLeft = 0;
          }
        }

#ifndef MSG_CMSG_CLOEXEC
        for (size_t i = 0; i < nfds; i++) {
          setCloseOnExec(fdBuffer[i]);
        }
#endif

        if (ancillaryMessages.size() > 0) {
          KJ_IF_SOME(fn, ancillaryMsgCallback) {
            fn(ancillaryMessages.asPtr());
          }
        }

        alreadyRead.capCount += nfds;
        fdBuffer += nfds;
        maxFds -= nfds;
      }
    }

    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then(
          [this, buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead]() {
              return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      alreadyRead.byteCount += n;
      return alreadyRead;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead.byteCount += n;

      // According to David Klempner, who works on Stubby at Google, we sadly CANNOT assume that
      // we've consumed the whole read buffer here. If a signal is delivered in the middle of a
      // read() -- yes, even a non-blocking read -- it can cause the kernel to return a partial
      // result, with data still in the buffer.
      //     https://bugzilla.kernel.org/show_bug.cgi?id=199131
      //     https://twitter.com/CaptainSegfault/status/1112622245531144194
      //
      // Unfortunately, we have no choice but to issue more read()s until it either tells us EOF
      // or EAGAIN. We used to have an optimization here using observer.atEndHint() (when it is
      // non-null) to avoid a redundant call to read(). Alas...
      return tryReadInternal(buffer, minBytes, maxBytes, fdBuffer, maxFds, alreadyRead);
    }
  }